

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_bzip2.c
# Opt level: O0

int archive_read_support_filter_bzip2(archive *_a)

{
  int iVar1;
  archive_read *in_RDI;
  int magic_test;
  archive_read_filter_bidder *reader;
  archive_read *a;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  archive_read_filter_bidder **in_stack_ffffffffffffffe0;
  archive_read *a_00;
  int local_4;
  
  a_00 = in_RDI;
  iVar1 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar1 == -0x1e) {
    local_4 = -0x1e;
  }
  else {
    iVar1 = __archive_read_get_bidder(a_00,in_stack_ffffffffffffffe0);
    if (iVar1 == 0) {
      *in_stack_ffffffffffffffe0 = (archive_read_filter_bidder *)0x0;
      in_stack_ffffffffffffffe0[1] = (archive_read_filter_bidder *)0x1bf350;
      in_stack_ffffffffffffffe0[2] = (archive_read_filter_bidder *)bzip2_reader_bid;
      in_stack_ffffffffffffffe0[3] = (archive_read_filter_bidder *)bzip2_reader_init;
      in_stack_ffffffffffffffe0[4] = (archive_read_filter_bidder *)0x0;
      in_stack_ffffffffffffffe0[5] = (archive_read_filter_bidder *)bzip2_reader_free;
      archive_set_error(&in_RDI->archive,-1,"Using external bzip2 program");
      local_4 = -0x14;
    }
    else {
      local_4 = -0x1e;
    }
  }
  return local_4;
}

Assistant:

int
archive_read_support_filter_bzip2(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter_bidder *reader;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_filter_bzip2");

	if (__archive_read_get_bidder(a, &reader) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	reader->data = NULL;
	reader->name = "bzip2";
	reader->bid = bzip2_reader_bid;
	reader->init = bzip2_reader_init;
	reader->options = NULL;
	reader->free = bzip2_reader_free;
#if defined(HAVE_BZLIB_H) && defined(BZ_CONFIG_ERROR)
	return (ARCHIVE_OK);
#else
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external bzip2 program");
	return (ARCHIVE_WARN);
#endif
}